

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

_Bool CrawlSpaces(Lexer *lexer)

{
  int *piVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  long lVar5;
  int iVar6;
  char character;
  bool bVar7;
  
  iVar2 = lexer->length;
  iVar6 = (lexer->tracker).currentTokenPosition;
  if (iVar6 < iVar2) {
    bVar7 = lexer->rawSourceCode[iVar6] == ' ';
  }
  else {
    bVar7 = false;
  }
  if (bVar7) {
    lVar5 = (long)iVar6 + 1;
    iVar4 = (int)lVar5;
    (lexer->tracker).currentTokenPosition = iVar4;
    character = -1;
    if (iVar4 < iVar2) {
      character = lexer->rawSourceCode[lVar5];
    }
    (lexer->tracker).currentTokenPosition = iVar6;
    _Var3 = IsCharacter(character," \n\r");
    if (_Var3) {
      iVar6 = (lexer->tracker).currentTokenPosition;
      lVar5 = (long)iVar6;
      do {
        iVar6 = iVar6 + 1;
        lVar5 = lVar5 + 1;
        if (character == '\n') {
          piVar1 = &(lexer->tracker).row;
          *piVar1 = *piVar1 + 1;
          (lexer->tracker).col = 1;
        }
        (lexer->tracker).currentTokenPosition = iVar6;
        character = -1;
        if (lVar5 < iVar2) {
          character = lexer->rawSourceCode[lVar5];
        }
        (lexer->tracker).currentTokenPosition = iVar6;
        _Var3 = IsCharacter(character," \n\r");
      } while (_Var3);
    }
    piVar1 = &(lexer->tracker).currentTokenPosition;
    *piVar1 = *piVar1 + 1;
  }
  return bVar7;
}

Assistant:

bool CrawlSpaces(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	if (currentChar == ' '){
		char nextChar = PeekNextCharacter(lexer);
		char* checkCharacters = " \n\r";
		while (IsCharacter(nextChar, checkCharacters)){
			if (nextChar == '\n'){
				lexer->tracker.row++;
				lexer->tracker.col = 1;
			}

			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
		}
		GetNextCharacter(lexer);
		return true;
	}
	return false;
}